

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O3

Ref_Man_t * Dar_ManRefStart(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  undefined4 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Ref_Man_t *pRVar6;
  Vec_Vec_t *pVVar7;
  void **ppvVar8;
  void *pvVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  void **ppvVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar24;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  
  pRVar6 = (Ref_Man_t *)calloc(1,0xa0);
  pRVar6->pAig = pAig;
  pRVar6->pPars = pPars;
  uVar21 = pPars->nCutsMax;
  pVVar7 = (Vec_Vec_t *)malloc(0x10);
  uVar20 = 8;
  if (6 < uVar21 - 1) {
    uVar20 = uVar21;
  }
  pVVar7->nCap = uVar20;
  if (uVar20 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)(int)uVar20 << 3);
  }
  pVVar7->pArray = ppvVar8;
  if (0 < (int)uVar21) {
    uVar19 = 0;
    do {
      pvVar9 = calloc(1,0x10);
      ppvVar8[uVar19] = pvVar9;
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
  }
  pVVar7->nSize = uVar21;
  pRVar6->vCuts = pVVar7;
  iVar22 = pPars->nLeafMax;
  uVar19 = (ulong)iVar22;
  uVar20 = 1 << ((char)iVar22 - 5U & 0x1f);
  uVar21 = 1;
  if (5 < (long)uVar19) {
    uVar21 = uVar20;
  }
  ppvVar8 = (void **)malloc(((long)(int)uVar21 * 4 + 8) * uVar19);
  if (0 < (long)uVar19) {
    ppvVar10 = ppvVar8 + uVar19;
    ppvVar14 = ppvVar8;
    uVar18 = uVar19;
    do {
      *ppvVar14 = ppvVar10;
      ppvVar14 = ppvVar14 + 1;
      ppvVar10 = (void **)((long)ppvVar10 + (long)(int)uVar21 * 4);
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nSize = iVar22;
  pVVar11->nCap = iVar22;
  pVVar11->pArray = ppvVar8;
  auVar5 = _DAT_0093e4e0;
  auVar4 = _DAT_0093d220;
  auVar3 = _DAT_0093d210;
  if (0 < iVar22) {
    lVar15 = (ulong)uVar21 - 1;
    auVar23._8_4_ = (int)lVar15;
    auVar23._0_8_ = lVar15;
    auVar23._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar18 = 0;
    auVar23 = auVar23 ^ _DAT_0093d220;
    do {
      pvVar9 = ppvVar8[uVar18];
      iVar22 = auVar23._0_4_;
      iVar24 = auVar23._4_4_;
      if (uVar18 < 5) {
        if (0 < (int)uVar21) {
          uVar1 = (&DAT_009e33f0)[uVar18];
          lVar15 = 0;
          auVar25 = auVar3;
          auVar26 = auVar5;
          do {
            auVar27 = auVar25 ^ auVar4;
            if ((bool)(~(auVar27._4_4_ == iVar24 && iVar22 < auVar27._0_4_ || iVar24 < auVar27._4_4_
                        ) & 1)) {
              *(undefined4 *)((long)pvVar9 + lVar15) = uVar1;
            }
            if ((auVar27._12_4_ != auVar23._12_4_ || auVar27._8_4_ <= auVar23._8_4_) &&
                auVar27._12_4_ <= auVar23._12_4_) {
              *(undefined4 *)((long)pvVar9 + lVar15 + 4) = uVar1;
            }
            iVar28 = SUB164(auVar26 ^ auVar4,4);
            if (iVar28 <= iVar24 && (iVar28 != iVar24 || SUB164(auVar26 ^ auVar4,0) <= iVar22)) {
              *(undefined4 *)((long)pvVar9 + lVar15 + 8) = uVar1;
              *(undefined4 *)((long)pvVar9 + lVar15 + 0xc) = uVar1;
            }
            lVar17 = auVar25._8_8_;
            auVar25._0_8_ = auVar25._0_8_ + 4;
            auVar25._8_8_ = lVar17 + 4;
            lVar17 = auVar26._8_8_;
            auVar26._0_8_ = auVar26._0_8_ + 4;
            auVar26._8_8_ = lVar17 + 4;
            lVar15 = lVar15 + 0x10;
          } while ((ulong)(uVar21 + 3 >> 2) << 4 != lVar15);
        }
      }
      else if (0 < (int)uVar21) {
        uVar20 = 1 << ((char)uVar18 - 5U & 0x1f);
        uVar16 = 0;
        auVar27 = auVar3;
        do {
          bVar2 = iVar22 < SUB164(auVar27 ^ auVar4,0);
          iVar28 = SUB164(auVar27 ^ auVar4,4);
          if ((bool)(~(iVar24 < iVar28 || iVar28 == iVar24 && bVar2) & 1)) {
            *(uint *)((long)pvVar9 + uVar16 * 4) = -(uint)((uVar20 & (uint)uVar16) != 0);
          }
          if (iVar24 >= iVar28 && (iVar28 != iVar24 || !bVar2)) {
            *(uint *)((long)pvVar9 + uVar16 * 4 + 4) = -(uint)(((uint)uVar16 + 1 & uVar20) != 0);
          }
          uVar16 = uVar16 + 2;
          lVar15 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar15 + 2;
        } while ((uVar21 + 1 & 0xfffffffe) != uVar16);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar19);
    iVar22 = pPars->nLeafMax;
    uVar20 = 1 << ((char)iVar22 - 5U & 0x1f);
  }
  pRVar6->vTruthElem = pVVar11;
  uVar21 = 1;
  if (5 < iVar22) {
    uVar21 = uVar20;
  }
  ppvVar8 = (void **)malloc((long)(int)uVar21 * 0x1000 + 0x2000);
  lVar15 = 0x2000;
  lVar17 = 0;
  do {
    ppvVar8[lVar17] = (void *)((long)ppvVar8 + lVar15);
    lVar17 = lVar17 + 1;
    lVar15 = lVar15 + (long)(int)uVar21 * 4;
  } while (lVar17 != 0x400);
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 0x400;
  pVVar11->nSize = 0x400;
  pVVar11->pArray = ppvVar8;
  pRVar6->vTruthStore = pVVar11;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 0x10000;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(0x40000);
  pVVar12->pArray = piVar13;
  pRVar6->vMemory = pVVar12;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  pVVar11->nCap = 0x100;
  pVVar11->nSize = 0;
  ppvVar8 = (void **)malloc(0x800);
  pVVar11->pArray = ppvVar8;
  pRVar6->vCutNodes = pVVar11;
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  iVar24 = 8;
  if (6 < iVar22 - 1U) {
    iVar24 = iVar22;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar24;
  if (iVar24 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)iVar24 << 3);
  }
  pVVar11->pArray = ppvVar8;
  pRVar6->vLeavesBest = pVVar11;
  (pRVar6->DecPars).nVarsMax = iVar22;
  (pRVar6->DecPars).fVerbose = pPars->fVerbose;
  (pRVar6->DecPars).fVeryVerbose = 0;
  return pRVar6;
}

Assistant:

Ref_Man_t * Dar_ManRefStart( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
    Ref_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ref_Man_t, 1 );
    memset( p, 0, sizeof(Ref_Man_t) );
    p->pAig         = pAig;
    p->pPars        = pPars;
    // other data
    p->vCuts        = Vec_VecStart( pPars->nCutsMax );
    p->vTruthElem   = Vec_PtrAllocTruthTables( pPars->nLeafMax );
    p->vTruthStore  = Vec_PtrAllocSimInfo( 1024, Kit_TruthWordNum(pPars->nLeafMax) );
    p->vMemory      = Vec_IntAlloc( 1 << 16 );
    p->vCutNodes    = Vec_PtrAlloc( 256 );
    p->vLeavesBest  = Vec_PtrAlloc( pPars->nLeafMax );
    // alloc bi-decomposition manager
    p->DecPars.nVarsMax = pPars->nLeafMax;
    p->DecPars.fVerbose = pPars->fVerbose;
    p->DecPars.fVeryVerbose = 0;
//    p->pManDec = Bdc_ManAlloc( &p->DecPars );
    return p;
}